

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

void __thiscall cmXMLParser::ReportError(cmXMLParser *this,int line,int param_2,char *msg)

{
  ostream *poVar1;
  char *msg_local;
  int param_2_local;
  int line_local;
  cmXMLParser *this_local;
  
  if (this->ReportCallback == (ReportFunction)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error parsing XML in stream at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,msg);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    (*this->ReportCallback)(line,msg,this->ReportCallbackData);
  }
  return;
}

Assistant:

void cmXMLParser::ReportError(int line, int, const char* msg)
{
  if(this->ReportCallback)
    {
    this->ReportCallback(line, msg, this->ReportCallbackData);
    }
  else
    {
    std::cerr << "Error parsing XML in stream at line "
              << line << ": " << msg << std::endl;
    }
}